

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O3

void __thiscall FIX::DataDictionary::checkMsgType(DataDictionary *this,MsgType *msgType)

{
  const_iterator cVar1;
  InvalidMessageType *this_00;
  string local_40;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->m_messages)._M_t,&(msgType->super_StringField).super_FieldBase.m_string);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->m_messages)._M_t._M_impl.super__Rb_tree_header) {
    return;
  }
  this_00 = (InvalidMessageType *)__cxa_allocate_exception(0x50);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  InvalidMessageType::InvalidMessageType(this_00,&local_40);
  __cxa_throw(this_00,&InvalidMessageType::typeinfo,FIX::Exception::~Exception);
}

Assistant:

void checkMsgType(const MsgType &msgType) const {
    if (!isMsgType(msgType.getValue())) {
      throw InvalidMessageType();
    }
  }